

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-format.hh
# Opt level: O2

optional<tinyusdz::Token> * __thiscall
tinyusdz::crate::CrateValue::get_value<tinyusdz::Token>
          (optional<tinyusdz::Token> *__return_storage_ptr__,CrateValue *this)

{
  optional<tinyusdz::Token> oStack_38;
  
  tinyusdz::value::Value::get_value<tinyusdz::Token>(&oStack_38,&this->value_,false);
  nonstd::optional_lite::optional<tinyusdz::Token>::optional<tinyusdz::Token,_0>
            (__return_storage_ptr__,&oStack_38);
  nonstd::optional_lite::optional<tinyusdz::Token>::~optional(&oStack_38);
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {
    return value_.get_value<T>();
  }